

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

size_t ggml_get_max_tensor_size(ggml_context *ctx)

{
  void *pvVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  ggml_object *pgVar5;
  long *plVar6;
  
  pgVar5 = ctx->objects_begin;
  if (pgVar5 == (ggml_object *)0x0) {
    return 0;
  }
  pvVar1 = ctx->mem_buffer;
  while (pgVar5->type != GGML_OBJECT_TYPE_TENSOR) {
    pgVar5 = pgVar5->next;
    if (pgVar5 == (ggml_object *)0x0) {
      return 0;
    }
  }
  if (pvVar1 == (void *)0x0) {
    return 0;
  }
  sVar4 = pgVar5->offs;
  sVar3 = ggml_nbytes((ggml_tensor *)((long)pvVar1 + sVar4));
  plVar6 = *(long **)((long)pvVar1 + (sVar4 - 0x10));
  do {
    if (plVar6 == (long *)0x0) {
      return sVar3;
    }
    while ((int)plVar6[3] == 0) {
      lVar2 = *plVar6;
      sVar4 = ggml_nbytes((ggml_tensor *)((long)pvVar1 + lVar2));
      if (sVar4 < sVar3) {
        sVar4 = sVar3;
      }
      plVar6 = *(long **)((long)pvVar1 + lVar2 + -0x10);
      sVar3 = sVar4;
      if (plVar6 == (long *)0x0) {
        return sVar4;
      }
    }
    plVar6 = (long *)plVar6[2];
  } while( true );
}

Assistant:

struct ggml_tensor * ggml_get_first_tensor(const struct ggml_context * ctx) {
    struct ggml_object * obj = ctx->objects_begin;

    char * const mem_buffer = ctx->mem_buffer;

    while (obj != NULL) {
        if (obj->type == GGML_OBJECT_TYPE_TENSOR) {
            return (struct ggml_tensor *)(mem_buffer + obj->offs);
        }

        obj = obj->next;
    }

    return NULL;
}